

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

bool_t ecIsOperableGroup(ec_o *ec)

{
  bool_t bVar1;
  long in_RDI;
  undefined1 local_9;
  
  bVar1 = memIsValid(*(void **)(in_RDI + 0x30),*(long *)(*(long *)(in_RDI + 0x18) + 0x30) << 4);
  local_9 = false;
  if (bVar1 != 0) {
    bVar1 = memIsValid(*(void **)(in_RDI + 0x38),
                       (*(long *)(*(long *)(in_RDI + 0x18) + 0x30) + 1) * 8);
    local_9 = false;
    if (bVar1 != 0) {
      bVar1 = wwIsZero(*(word **)(in_RDI + 0x38),*(long *)(*(long *)(in_RDI + 0x18) + 0x30) + 1);
      local_9 = false;
      if (bVar1 == 0) {
        local_9 = *(long *)(in_RDI + 0x50) != 0;
      }
    }
  }
  return (bool_t)local_9;
}

Assistant:

bool_t ecIsOperableGroup(const ec_o* ec)
{
	ASSERT(ecIsOperable(ec));
	return wwIsValid(ec->base, 2 * ec->f->n) &&
		wwIsValid(ec->order, ec->f->n + 1) &&
		!wwIsZero(ec->order, ec->f->n + 1) &&
		ec->cofactor != 0;
}